

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::DrawIndexedIndirect
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,DrawIndexedIndirectAttribs *Attribs
          ,int param_2)

{
  String *__return_storage_ptr__;
  DRAW_FLAGS DVar1;
  bool bVar2;
  COMMAND_QUEUE_TYPE CVar3;
  DRAW_COMMAND_CAP_FLAGS DVar4;
  Char *pCVar5;
  RenderDeviceGLImpl *this_00;
  GraphicsAdapterInfo *pGVar6;
  PipelineStateGLImpl *pPVar7;
  PipelineStateDesc *pPVar8;
  RenderPassGLImpl *pRVar9;
  COMMAND_QUEUE_TYPE Type;
  char *in_R8;
  char (*in_R9) [8];
  undefined1 local_170 [8];
  string msg_8;
  string msg_7;
  string msg_6;
  string msg_5;
  string msg_4;
  string msg_3;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  int param_2_local;
  DrawIndexedIndirectAttribs *Attribs_local;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._12_4_ = param_2;
  DVar1 = Diligent::operator&(Attribs->Flags,DRAW_FLAG_VERIFY_DRAW_ATTRIBS);
  if (DVar1 != DRAW_FLAG_NONE) {
    if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
      bVar2 = IsDeferred(this);
      if (!bVar2) {
        FormatString<char[79]>
                  ((string *)local_40,
                   (char (*) [79])
                   "Queue type may never be unknown for immediate contexts. This looks like a bug.")
        ;
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"DrawIndexedIndirect",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x93e);
        std::__cxx11::string::~string((string *)local_40);
      }
      FormatString<char[97]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [97])
                 "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x93e);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    CVar3 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
    if (CVar3 != COMMAND_QUEUE_TYPE_GRAPHICS) {
      __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
      GetCommandQueueTypeString_abi_cxx11_
                (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
      in_R8 = " queue.";
      FormatString<char[20],char[22],std::__cxx11::string,char[8]>
                ((string *)local_90,(Diligent *)0xe46989,(char (*) [20])0xf4cb59,
                 (char (*) [22])__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x93e);
      std::__cxx11::string::~string((string *)local_90);
    }
    if (Attribs->pCounterBuffer != (IBuffer *)0x0) {
      this_00 = RefCntAutoPtr<Diligent::RenderDeviceGLImpl>::operator->(&this->m_pDevice);
      pGVar6 = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetAdapterInfo
                         (&this_00->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
      DVar4 = Diligent::operator&((pGVar6->DrawCommand).CapFlags,
                                  DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER);
      if (DVar4 == DRAW_COMMAND_CAP_FLAG_NONE) {
        FormatString<char[137]>
                  ((string *)((long)&msg_4.field_2 + 8),
                   (char (*) [137])
                   "DrawIndexedIndirect command arguments are invalid: counter buffer requires DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER capability"
                  );
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"DrawIndexedIndirect",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x941);
        std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
      }
    }
    bVar2 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator!(&this->m_pPipelineState);
    if (bVar2) {
      FormatString<char[79]>
                ((string *)((long)&msg_5.field_2 + 8),
                 (char (*) [79])
                 "DrawIndexedIndirect command arguments are invalid: no pipeline state is bound.");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x944);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
    pPVar7 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->(&this->m_pPipelineState);
    pPVar8 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetDesc
                       (&pPVar7->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    if (pPVar8->PipelineType != PIPELINE_TYPE_GRAPHICS) {
      pPVar7 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->(&this->m_pPipelineState);
      pPVar8 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetDesc
                         (&pPVar7->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      FormatString<char[68],char_const*,char[30]>
                ((string *)((long)&msg_6.field_2 + 8),
                 (Diligent *)"DrawIndexedIndirect command arguments are invalid: pipeline state \'",
                 (char (*) [68])pPVar8,(char **)"\' is not a graphics pipeline.",
                 (char (*) [30])in_R8);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x948);
      std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
    }
    bVar2 = RefCntAutoPtr<Diligent::BufferGLImpl>::operator!(&this->m_pIndexBuffer);
    if (bVar2) {
      FormatString<char[77]>
                ((string *)((long)&msg_7.field_2 + 8),
                 (char (*) [77])
                 "DrawIndexedIndirect command arguments are invalid: no index buffer is bound.");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x94a);
      std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
    }
    pRVar9 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassGLImpl_
                       ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
    if ((pRVar9 != (RenderPassGLImpl *)0x0) &&
       (Attribs->AttribsBufferStateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION)) {
      FormatString<char[188]>
                ((string *)((long)&msg_8.field_2 + 8),
                 (char (*) [188])
                 "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first."
                );
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x94e);
      std::__cxx11::string::~string((string *)(msg_8.field_2._M_local_buf + 8));
    }
    bVar2 = VerifyDrawIndexedIndirectAttribs(Attribs);
    if (!bVar2) {
      FormatString<char[39]>
                ((string *)local_170,(char (*) [39])"DrawIndexedIndirectAttribs are invalid");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x950);
      std::__cxx11::string::~string((string *)local_170);
    }
  }
  (this->m_Stats).CommandCounters.DrawIndexedIndirect =
       (this->m_Stats).CommandCounters.DrawIndexedIndirect + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::DrawIndexedIndirect(const DrawIndexedIndirectAttribs& Attribs, int)
{
#ifdef DILIGENT_DEVELOPMENT
    if ((Attribs.Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != 0)
    {
        DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "DrawIndexedIndirect");

        DEV_CHECK_ERR(Attribs.pCounterBuffer == nullptr || (m_pDevice->GetAdapterInfo().DrawCommand.CapFlags & DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER) != 0,
                      "DrawIndexedIndirect command arguments are invalid: counter buffer requires DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER capability");
        // There is no need to check DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT because an indirect buffer can only be created if this capability is supported.

        DEV_CHECK_ERR(m_pPipelineState, "DrawIndexedIndirect command arguments are invalid: no pipeline state is bound.");

        DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_GRAPHICS,
                      "DrawIndexedIndirect command arguments are invalid: pipeline state '",
                      m_pPipelineState->GetDesc().Name, "' is not a graphics pipeline.");

        DEV_CHECK_ERR(m_pIndexBuffer, "DrawIndexedIndirect command arguments are invalid: no index buffer is bound.");

        DEV_CHECK_ERR(m_pActiveRenderPass == nullptr || Attribs.AttribsBufferStateTransitionMode != RESOURCE_STATE_TRANSITION_MODE_TRANSITION,
                      "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. "
                      "Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first.");

        DEV_CHECK_ERR(VerifyDrawIndexedIndirectAttribs(Attribs), "DrawIndexedIndirectAttribs are invalid");
    }
#endif
    ++m_Stats.CommandCounters.DrawIndexedIndirect;
}